

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O2

void __thiscall bloaty::dwarf::AbbrevTable::ReadAbbrevs(AbbrevTable *this,string_view data)

{
  bool bVar1;
  unsigned_short uVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  string_view format;
  undefined4 uStack_f8;
  uint32_t code;
  string_view data_local;
  Attribute attr;
  string local_b0;
  Arg local_90;
  Arg local_60;
  
  pcVar4 = data._M_str;
  data_local._M_len = data._M_len;
  data_local._M_str = pcVar4;
  while( true ) {
    code = ReadLEB128<unsigned_int>(&data_local);
    if (code == 0) {
      (this->abbrev_data_)._M_len = (long)data_local._M_str - (long)pcVar4;
      (this->abbrev_data_)._M_str = pcVar4;
      return;
    }
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bloaty::dwarf::AbbrevTable::Abbrev>,_std::allocator<std::pair<const_unsigned_int,_bloaty::dwarf::AbbrevTable::Abbrev>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bloaty::dwarf::AbbrevTable::Abbrev>,_std::allocator<std::pair<const_unsigned_int,_bloaty::dwarf::AbbrevTable::Abbrev>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&code);
    if (pmVar3->code != 0) break;
    pmVar3->code = code;
    uVar2 = ReadLEB128<unsigned_short>(&data_local);
    pmVar3->tag = uVar2;
    bVar1 = (bool)ReadFixed<unsigned_char,1ul>(&data_local);
    if (true < bVar1) {
      absl::substitute_internal::Arg::Arg((Arg *)&attr,(uint)bVar1);
      absl::substitute_internal::Arg::Arg(&local_60,pmVar3->code);
      absl::substitute_internal::Arg::Arg(&local_90,pmVar3->tag);
      format._M_str = (char *)&attr;
      format._M_len = (size_t)"DWARF has_child is neither true nor false: $0, code=$1, tag=$2";
      absl::Substitute_abi_cxx11_
                (&local_b0,(absl *)0x3e,format,&local_60,&local_90,(Arg *)CONCAT44(code,uStack_f8));
      Throw(local_b0._M_dataplus._M_p,0x39);
    }
    pmVar3->has_child = bVar1;
    while( true ) {
      attr.name = ReadLEB128<unsigned_short>(&data_local);
      attr.form = ReadLEB128<unsigned_short>(&data_local);
      if (attr.name == 0 && attr.form == 0) break;
      if (attr.form == 0x21) {
        ReadLEB128<long>(&data_local);
      }
      std::
      vector<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
      ::push_back(&pmVar3->attr,&attr);
    }
  }
  Throw("DWARF data contained duplicate abbrev code",0x27);
}

Assistant:

void AbbrevTable::ReadAbbrevs(string_view data) {
  const char* start = data.data();
  while (true) {
    uint32_t code = ReadLEB128<uint32_t>(&data);

    if (code == 0) {
      abbrev_data_ = string_view(start, data.data() - start);
      return;
    }

    Abbrev& abbrev = abbrev_[code];

    if (abbrev.code) {
      THROW("DWARF data contained duplicate abbrev code");
    }

    uint8_t has_child;

    abbrev.code = code;
    abbrev.tag = ReadLEB128<uint16_t>(&data);
    has_child = ReadFixed<uint8_t>(&data);

    switch (has_child) {
      case DW_children_yes:
        abbrev.has_child = true;
        break;
      case DW_children_no:
        abbrev.has_child = false;
        break;
      default:
        THROWF("DWARF has_child is neither true nor false: $0, code=$1, tag=$2",
               has_child, abbrev.code, abbrev.tag);
    }

    while (true) {
      Attribute attr;
      attr.name = ReadLEB128<uint16_t>(&data);
      attr.form = ReadLEB128<uint16_t>(&data);

      if (attr.name == 0 && attr.form == 0) {
        break;  // End of this abbrev
      }
      if (attr.form == DW_FORM_implicit_const) {
        // We don't use the constant value, just discard it.
        ReadLEB128<int64_t>(&data);
      }
      abbrev.attr.push_back(attr);
    }
  }
}